

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O0

NotificationHandle * __thiscall
jsonrpccxx::GetHandle<std::__cxx11::string_const&>
          (NotificationHandle *__return_storage_ptr__,jsonrpccxx *this,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *f)

{
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *method;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_38;
  jsonrpccxx *local_18;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *f_local;
  
  local_18 = this;
  f_local = (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)__return_storage_ptr__;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_38,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)this);
  notificationHandle<std::__cxx11::string_const&>
            (__return_storage_ptr__,(jsonrpccxx *)&local_38,method);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_38);
  return __return_storage_ptr__;
}

Assistant:

NotificationHandle GetHandle(std::function<void(ParamTypes...)> f) {
    return notificationHandle(f);
  }